

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

void free_dungeon(void)

{
  branch *pbVar1;
  s_level *psVar2;
  branch *__ptr;
  s_level *__ptr_00;
  
  __ptr = branches;
  while (__ptr != (branch *)0x0) {
    pbVar1 = __ptr->next;
    free(__ptr);
    __ptr = pbVar1;
  }
  branches = (branch *)0x0;
  __ptr_00 = sp_levchn;
  while (__ptr_00 != (s_level *)0x0) {
    psVar2 = __ptr_00->next;
    free(__ptr_00);
    __ptr_00 = psVar2;
  }
  sp_levchn = (s_level *)0x0;
  return;
}

Assistant:

void free_dungeon(void)
{
    branch *curr, *next;
    
    for (curr = branches; curr; curr = next) {
	next = curr->next;
	free(curr);
    }
    branches = NULL;
    
    freelevchn();
}